

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_test_connection.c
# Opt level: O2

apx_error_t
apx_clientTestConnection_request_open_local_file(apx_clientTestConnection_t *self,char *file_name)

{
  apx_size_t aVar1;
  uint32_t address;
  apx_error_t aVar2;
  apx_fileManager_t *self_00;
  apx_file_t *self_01;
  uint8_t buffer [12];
  
  if (file_name == (char *)0x0 || self == (apx_clientTestConnection_t *)0x0) {
    aVar2 = 1;
  }
  else {
    self_00 = apx_clientConnection_get_file_manager(&self->base);
    if (self_00 == (apx_fileManager_t *)0x0) {
      __assert_fail("file_manager != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client_test_connection.c"
                    ,0x11d,
                    "apx_error_t apx_clientTestConnection_request_open_local_file(apx_clientTestConnection_t *, const char *)"
                   );
    }
    self_01 = apx_fileManager_find_local_file_by_name(self_00,file_name);
    if (self_01 == (apx_file_t *)0x0) {
      aVar2 = 0x31;
    }
    else {
      aVar1 = rmf_address_encode(buffer,4,0x3ffffc00,false);
      aVar2 = 6;
      if (aVar1 == 4) {
        address = apx_file_get_address_without_flags(self_01);
        aVar1 = rmf_encode_open_file_cmd(buffer + 4,8,address);
        if (aVar1 != 0) {
          aVar2 = apx_fileManager_message_received(self_00,buffer,0xc);
        }
      }
    }
  }
  return aVar2;
}

Assistant:

apx_error_t apx_clientTestConnection_request_open_local_file(apx_clientTestConnection_t* self, char const* file_name)
{
   if ( (self != NULL) && (file_name != NULL) )
   {
      uint8_t  buffer[RMF_HIGH_ADDR_SIZE + RMF_CMD_TYPE_SIZE + RMF_FILE_OPEN_CMD_SIZE];
      apx_fileManager_t* file_manager = apx_clientConnection_get_file_manager(&self->base);
      assert(file_manager != NULL);
      apx_file_t* file = apx_fileManager_find_local_file_by_name(file_manager, file_name);
      if (file == NULL)
      {
         return APX_FILE_NOT_FOUND_ERROR;
      }
      if (rmf_address_encode(buffer, RMF_HIGH_ADDR_SIZE, RMF_CMD_AREA_START_ADDRESS, false) != RMF_HIGH_ADDR_SIZE)
      {
         return APX_INTERNAL_ERROR;
      }
      apx_size_t const cmd_size = RMF_CMD_TYPE_SIZE + RMF_FILE_OPEN_CMD_SIZE;
      apx_size_t result = rmf_encode_open_file_cmd(buffer + RMF_HIGH_ADDR_SIZE, cmd_size, apx_file_get_address_without_flags(file));
      if (result == 0)
      {
         return APX_INTERNAL_ERROR;
      }
      return apx_fileManager_message_received(file_manager, buffer, sizeof(buffer));
   }
   return APX_INVALID_ARGUMENT_ERROR;
}